

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
ModbusSimulationDataGenerator::Initialize
          (ModbusSimulationDataGenerator *this,U32 simulation_sample_rate,
          ModbusAnalyzerSettings *settings)

{
  ulong uVar1;
  int i;
  U32 UVar2;
  ulong uVar3;
  int iVar4;
  U64 UVar5;
  uint uVar6;
  ulong uVar7;
  BitState BVar8;
  ulong uVar9;
  BitState BVar10;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  ClockGenerator::Init((double)settings->mBitRate,(int)this + 0x28);
  SimulationChannelDescriptor::SetChannel((Channel *)&this->mModbusSimulationData);
  BVar10 = (BitState)&this->mModbusSimulationData;
  SimulationChannelDescriptor::SetSampleRate(BVar10);
  BVar8 = (BitState)this->mSettings->mInverted;
  this->mBitLow = BVar8;
  this->mBitHigh = BVar8 ^ BIT_HIGH;
  SimulationChannelDescriptor::SetInitialBitState(BVar10);
  ClockGenerator::AdvanceByHalfPeriod(10.0);
  SimulationChannelDescriptor::Advance(BVar10);
  this->mValue = 0;
  this->mNumBitsMask = 0;
  UVar2 = this->mSettings->mBitsPerTransfer;
  if (UVar2 != 0) {
    UVar5 = 0;
    do {
      UVar5 = UVar5 * 2 + 1;
      UVar2 = UVar2 - 1;
    } while (UVar2 != 0);
    this->mNumBitsMask = UVar5;
  }
  uVar3 = 0;
  do {
    iVar4 = 8;
    uVar7 = 0;
    uVar9 = uVar3 & 0xffffffff;
    do {
      uVar6 = (uint)uVar7;
      uVar1 = (uVar7 & 0xffff) >> 1;
      uVar7 = (ulong)((uint)uVar1 ^ 0xffffa001);
      if (((uVar6 ^ (uint)uVar9) & 1) == 0) {
        uVar7 = uVar1;
      }
      uVar9 = (ulong)((uint)uVar9 >> 1);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    this->crc_tab16[uVar3] = (U16)uVar7;
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x100);
  return;
}

Assistant:

void ModbusSimulationDataGenerator::Initialize( U32 simulation_sample_rate, ModbusAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    mClockGenerator.Init( mSettings->mBitRate, simulation_sample_rate );
    mModbusSimulationData.SetChannel( mSettings->mInputChannel );
    mModbusSimulationData.SetSampleRate( simulation_sample_rate );

    if( mSettings->mInverted == false )
    {
        mBitLow = BIT_LOW;
        mBitHigh = BIT_HIGH;
    }
    else
    {
        mBitLow = BIT_HIGH;
        mBitHigh = BIT_LOW;
    }

    mModbusSimulationData.SetInitialBitState( mBitHigh );
    mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

    mValue = 0;
    mNumBitsMask = 0;

    U32 num_bits = mSettings->mBitsPerTransfer;
    for( U32 i = 0; i < num_bits; i++ )
    {
        mNumBitsMask <<= 1;
        mNumBitsMask |= 0x1;
    }

    // used for calculating Modbus Checksum values
    init_crc16_tab();
}